

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::TightenBoundsPS::TightenBoundsPS
          (TightenBoundsPS *this,TightenBoundsPS *old)

{
  int iVar1;
  PostStep *in_RSI;
  PostStep *in_RDI;
  
  PostStep::PostStep(in_RSI,in_RDI);
  in_RDI->_vptr_PostStep = (_func_int **)&PTR__TightenBoundsPS_00897d48;
  *(undefined4 *)&in_RDI[1]._vptr_PostStep = *(undefined4 *)&in_RSI[1]._vptr_PostStep;
  in_RDI[1].m_name = in_RSI[1].m_name;
  iVar1 = in_RSI[1].nRows;
  in_RDI[1].nCols = in_RSI[1].nCols;
  in_RDI[1].nRows = iVar1;
  return;
}

Assistant:

TightenBoundsPS(const TightenBoundsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_origupper(old.m_origupper)
         , m_origlower(old.m_origlower)
      {}